

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryDiv<FadCst<int>,_Fad<Fad<double>_>_>::val
          (FadBinaryDiv<FadCst<int>,_Fad<Fad<double>_>_> *this)

{
  Fad<double> *in_RSI;
  value_type *in_RDI;
  Fad<double> *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  FadExpr<FadBinaryDiv<FadCst<int>,_Fad<double>_>_> *in_stack_ffffffffffffffe8;
  Fad<double> *this_00;
  
  this_00 = in_RSI;
  FadCst<int>::val((FadCst<int> *)in_RSI);
  Fad<Fad<double>_>::val(*(Fad<Fad<double>_> **)&in_RSI->dx_);
  operator/<int,_Fad<double>,_nullptr>(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
  Fad<double>::Fad<FadBinaryDiv<FadCst<int>,Fad<double>>>(this_00,in_stack_ffffffffffffffe8);
  FadExpr<FadBinaryDiv<FadCst<int>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryDiv<FadCst<int>,_Fad<double>_>_> *)in_RDI);
  return in_RDI;
}

Assistant:

const value_type val() const {return left_.val() / right_.val();}